

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_mul_comb_core(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *T,uchar t_len,
                     uchar *x,size_t d,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t local_90;
  size_t i;
  mbedtls_ecp_point Txi;
  int ret;
  size_t d_local;
  uchar *x_local;
  uchar t_len_local;
  mbedtls_ecp_point *T_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&i);
  Txi.Z.p._4_4_ = ecp_select_comb(grp,R,T,t_len,x[d]);
  if ((Txi.Z.p._4_4_ == 0) && (Txi.Z.p._4_4_ = mbedtls_mpi_lset(&R->Z,1), Txi.Z.p._4_4_ == 0)) {
    local_90 = d;
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_001c282a;
    Txi.Z.p._4_4_ = ecp_randomize_jac(grp,R,f_rng,p_rng);
    local_90 = d;
    while (Txi.Z.p._4_4_ == 0) {
LAB_001c282a:
      if (((local_90 == 0) || (Txi.Z.p._4_4_ = ecp_double_jac(grp,R,R), Txi.Z.p._4_4_ != 0)) ||
         (Txi.Z.p._4_4_ = ecp_select_comb(grp,(mbedtls_ecp_point *)&i,T,t_len,x[local_90 - 1]),
         Txi.Z.p._4_4_ != 0)) break;
      Txi.Z.p._4_4_ = ecp_add_mixed(grp,R,R,(mbedtls_ecp_point *)&i);
      local_90 = local_90 - 1;
    }
  }
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&i);
  return Txi.Z.p._4_4_;
}

Assistant:

static int ecp_mul_comb_core( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                              const mbedtls_ecp_point T[], unsigned char t_len,
                              const unsigned char x[], size_t d,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng )
{
    int ret;
    mbedtls_ecp_point Txi;
    size_t i;

    mbedtls_ecp_point_init( &Txi );

    /* Start with a non-zero point and randomize its coordinates */
    i = d;
    MBEDTLS_MPI_CHK( ecp_select_comb( grp, R, T, t_len, x[i] ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &R->Z, 1 ) );
    if( f_rng != 0 )
        MBEDTLS_MPI_CHK( ecp_randomize_jac( grp, R, f_rng, p_rng ) );

    while( i-- != 0 )
    {
        MBEDTLS_MPI_CHK( ecp_double_jac( grp, R, R ) );
        MBEDTLS_MPI_CHK( ecp_select_comb( grp, &Txi, T, t_len, x[i] ) );
        MBEDTLS_MPI_CHK( ecp_add_mixed( grp, R, R, &Txi ) );
    }

cleanup:
    mbedtls_ecp_point_free( &Txi );

    return( ret );
}